

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

NodeResult __thiscall HighsSearch::dive(HighsSearch *this)

{
  bool bVar1;
  NodeResult NVar2;
  
  HighsHashTable<int,_int>::clear(&this->reliableatnode);
  while( true ) {
    this->nnodes = this->nnodes + 1;
    NVar2 = evaluateNode(this);
    bVar1 = HighsMipSolverData::checkLimits
                      ((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,this->nnodes
                      );
    if (NVar2 != kOpen) {
      return NVar2;
    }
    if (bVar1) break;
    NVar2 = branch(this);
    if (NVar2 != kBranched) {
      return NVar2;
    }
  }
  return kOpen;
}

Assistant:

HighsSearch::NodeResult HighsSearch::dive() {
  reliableatnode.clear();

  do {
    ++nnodes;
    NodeResult result = evaluateNode();

    if (mipsolver.mipdata_->checkLimits(nnodes)) return result;

    if (result != NodeResult::kOpen) return result;

    result = branch();
    if (result != NodeResult::kBranched) return result;
  } while (true);
}